

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

bool FIX::thread_spawn(THREAD_START_ROUTINE *func,void *var,thread_id *thread)

{
  int iVar1;
  thread_id result;
  pthread_t local_10;
  
  local_10 = 0;
  iVar1 = pthread_create(&local_10,(pthread_attr_t *)0x0,(__start_routine *)func,var);
  if (iVar1 == 0) {
    *thread = local_10;
  }
  return iVar1 == 0;
}

Assistant:

bool thread_spawn( THREAD_START_ROUTINE func, void* var, thread_id& thread )
{
#ifdef _MSC_VER
  thread_id result = 0;
  unsigned int id = 0;
  result = _beginthreadex( NULL, 0, func, var, 0, &id );
  if ( result == 0 ) return false;
#else
  thread_id result = 0;
  if( pthread_create( &result, 0, func, var ) != 0 ) return false;
#endif
  thread = result;
  return true;
}